

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O3

void __thiscall
slang::ast::BinsSelectExpr::visit<slang::ast::ASTSerializer>
          (BinsSelectExpr *this,ASTSerializer *visitor)

{
  (*(code *)(&DAT_00a417b4 + *(int *)(&DAT_00a417b4 + (ulong)this->kind * 4)))
            (this,this,&DAT_00a417b4,&DAT_00a417b4 + *(int *)(&DAT_00a417b4 + (ulong)this->kind * 4)
            );
  return;
}

Assistant:

decltype(auto) BinsSelectExpr::visit(TVisitor& visitor, Args&&... args) const {
    // clang-format off
#define CASE(k, n) case BinsSelectExprKind::k: return visitor.visit(*static_cast<const n*>(this), std::forward<Args>(args)...)
    switch (kind) {
        CASE(Invalid, InvalidBinsSelectExpr);
        CASE(Condition, ConditionBinsSelectExpr);
        CASE(Unary, UnaryBinsSelectExpr);
        CASE(Binary, BinaryBinsSelectExpr);
        CASE(SetExpr, SetExprBinsSelectExpr);
        CASE(WithFilter, BinSelectWithFilterExpr);
        CASE(CrossId, CrossIdBinsSelectExpr);
    }
#undef CASE
    // clang-format on
    SLANG_UNREACHABLE;
}